

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O3

CURLcode Curl_SOCKS5(char *proxy_user,char *proxy_password,char *hostname,int remote_port,
                    int sockindex,connectdata *conn)

{
  ushort uVar1;
  curl_socket_t sockfd;
  curl_proxytype cVar2;
  ulong uVar3;
  Curl_addrinfo *ai;
  sockaddr *psVar4;
  uint uVar5;
  CURLcode CVar6;
  int iVar7;
  size_t __n;
  timediff_t timeout_ms;
  size_t sVar8;
  size_t __n_00;
  long lVar9;
  uchar uVar10;
  char *pcVar11;
  Curl_easy *data;
  ssize_t actualread;
  ulong local_310;
  char *local_308;
  ssize_t written;
  size_t local_2f8;
  ulong local_2f0;
  Curl_dns_entry *dns;
  undefined8 local_2e0;
  uchar socksreq [600];
  char buf [64];
  
  local_310 = CONCAT44(local_310._4_4_,remote_port);
  sockfd = conn->sock[sockindex];
  data = conn->data;
  cVar2 = (conn->socks_proxy).proxytype;
  local_2f0 = CONCAT71(local_2f0._1_7_,cVar2 == CURLPROXY_SOCKS5);
  local_308 = proxy_password;
  __n = strlen(hostname);
  uVar3 = (data->set).socks5auth;
  if ((conn->bits).httpproxy == true) {
    Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d\n",hostname,local_310 & 0xffffffff)
    ;
  }
  if (0xff < __n && cVar2 != CURLPROXY_SOCKS5) {
    Curl_infof(conn->data,
               "SOCKS5: server resolving disabled for hostnames of length > 255 [actual len=%zu]\n",
               __n);
    local_2f0 = CONCAT71(local_2f0._1_7_,1);
  }
  timeout_ms = Curl_timeleft(data,(curltime *)0x0,true);
  if (timeout_ms < 0) {
    pcVar11 = "Connection time-out";
LAB_00130375:
    Curl_failf(data,pcVar11);
    return CURLE_OPERATION_TIMEDOUT;
  }
  curlx_nonblock(sockfd,1);
  uVar5 = Curl_socket_check(-1,-1,sockfd,timeout_ms);
  if (uVar5 == 0) {
    data = conn->data;
    pcVar11 = "SOCKS5: connection timeout";
    goto LAB_00130375;
  }
  if (uVar5 == 0xffffffff) {
    data = conn->data;
    pcVar11 = "SOCKS5: no connection here";
    goto LAB_00130478;
  }
  if ((uVar5 & 4) != 0) {
    data = conn->data;
    pcVar11 = "SOCKS5: error occurred during connection";
    goto LAB_00130478;
  }
  if ((uVar3 & 0xfffffffffffffffa) != 0) {
    Curl_infof(conn->data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu\n",uVar3);
  }
  socksreq[2] = '\0';
  pcVar11 = (char *)(-(ulong)((uint)uVar3 & 1) & (ulong)proxy_user);
  if (pcVar11 == (char *)0x0) {
    uVar10 = '\x01';
  }
  else {
    socksreq[3] = '\x02';
    uVar10 = '\x02';
  }
  socksreq[1] = uVar10;
  socksreq[0] = '\x05';
  curlx_nonblock(sockfd,0);
  Curl_infof(data,"SOCKS5 communication to %s:%d\n",hostname,local_310 & 0xffffffff);
  CVar6 = Curl_write_plain(conn,sockfd,socksreq,(ulong)(byte)(uVar10 + 2),&written);
  if ((CVar6 != CURLE_OK) || (written != (ulong)socksreq[1] + 2)) {
    pcVar11 = "Unable to send initial SOCKS5 request.";
    goto LAB_00130478;
  }
  curlx_nonblock(sockfd,1);
  uVar5 = Curl_socket_check(sockfd,-1,-1,timeout_ms);
  if (uVar5 == 0) {
    data = conn->data;
    pcVar11 = "SOCKS5 read timeout";
    goto LAB_00130375;
  }
  if (uVar5 == 0xffffffff) {
    data = conn->data;
    pcVar11 = "SOCKS5 nothing to read";
    goto LAB_00130478;
  }
  if ((uVar5 & 4) != 0) {
    Curl_failf(conn->data,"SOCKS5 read error occurred");
    return CURLE_RECV_ERROR;
  }
  curlx_nonblock(sockfd,0);
  iVar7 = Curl_blockread_all(conn,sockfd,(char *)socksreq,2,&actualread);
  if ((iVar7 != 0) || (actualread != 2)) {
    pcVar11 = "Unable to receive initial SOCKS5 response.";
    goto LAB_00130478;
  }
  if (socksreq[0] != '\x05') {
    pcVar11 = "Received invalid version in initial SOCKS5 response.";
    goto LAB_00130478;
  }
  if (socksreq[1] < 2) {
    if (socksreq[1] != '\0') {
      if (socksreq[1] == '\x01') {
        pcVar11 = "SOCKS5 GSSAPI per-message authentication is not supported.";
        goto LAB_00130478;
      }
LAB_001305db:
      pcVar11 = "Undocumented SOCKS5 mode attempted to be used by server.";
      goto LAB_00130478;
    }
  }
  else {
    if (socksreq[1] == 0xff) {
      if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
        pcVar11 = 
        "No authentication method was acceptable. (It is quite likely that the SOCKS5 server wanted a username/password, since none was supplied to the server on this connection.)"
        ;
      }
      else {
        pcVar11 = "No authentication method was acceptable.";
      }
      goto LAB_00130478;
    }
    if (socksreq[1] != '\x02') goto LAB_001305db;
    if ((local_308 == (char *)0x0) || (pcVar11 == (char *)0x0)) {
      socksreq[0] = '\x01';
      socksreq[1] = '\0';
      socksreq[2] = '\0';
      lVar9 = 3;
      __n_00 = 0;
    }
    else {
      sVar8 = strlen(pcVar11);
      local_2f8 = sVar8;
      __n_00 = strlen(local_308);
      socksreq[1] = (uchar)sVar8;
      socksreq[0] = '\x01';
      if (sVar8 != 0) {
        memcpy(socksreq + 2,pcVar11,local_2f8);
      }
      lVar9 = sVar8 + 3;
      socksreq[local_2f8 + 2] = (uchar)__n_00;
      if (__n_00 == 0) {
        __n_00 = 0;
      }
      else {
        memcpy(socksreq + sVar8 + 3,local_308,__n_00);
      }
    }
    CVar6 = Curl_write_plain(conn,sockfd,socksreq,lVar9 + __n_00,&written);
    if ((CVar6 != CURLE_OK) || (lVar9 + __n_00 != written)) {
      pcVar11 = "Failed to send SOCKS5 sub-negotiation request.";
      goto LAB_00130478;
    }
    iVar7 = Curl_blockread_all(conn,sockfd,(char *)socksreq,2,&actualread);
    if ((iVar7 != 0) || (actualread != 2)) {
      pcVar11 = "Unable to receive SOCKS5 sub-negotiation response.";
      goto LAB_00130478;
    }
    if (socksreq[1] != '\0') {
      Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)socksreq[0]);
      return CURLE_COULDNT_CONNECT;
    }
  }
  socksreq[0] = '\x05';
  socksreq[1] = '\x01';
  socksreq[2] = '\0';
  if ((char)local_2f0 == '\0') {
    socksreq[3] = '\x03';
    socksreq[4] = (uchar)__n;
    memcpy(socksreq + 5,hostname,__n);
    lVar9 = __n + 5;
  }
  else {
    iVar7 = Curl_resolv(conn,hostname,(int)local_310,&dns);
    if (iVar7 == -1) {
      return CURLE_COULDNT_RESOLVE_HOST;
    }
    if ((iVar7 == 1) && (CVar6 = Curl_resolver_wait_resolv(conn,&dns), CVar6 != CURLE_OK)) {
      return CVar6;
    }
    if ((dns == (Curl_dns_entry *)0x0) || (ai = dns->addr, ai == (Curl_addrinfo *)0x0)) {
LAB_001308ee:
      Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
    Curl_printable_address(ai,buf,0x40);
    if (ai->ai_family == 10) {
      socksreq[3] = '\x04';
      psVar4 = ai->ai_addr;
      lVar9 = 0;
      pcVar11 = "SOCKS5 connect to IPv6 %s (locally resolved)\n";
      do {
        socksreq[lVar9 + 4] = psVar4->sa_data[lVar9 + 6];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      lVar9 = 0x14;
    }
    else {
      if (ai->ai_family != 2) {
        Curl_failf(data,"SOCKS5 connection to %s not supported\n",buf);
        Curl_resolv_unlock(data,dns);
        goto LAB_001308ee;
      }
      socksreq[3] = '\x01';
      psVar4 = ai->ai_addr;
      lVar9 = 0;
      pcVar11 = "SOCKS5 connect to IPv4 %s (locally resolved)\n";
      do {
        socksreq[lVar9 + 4] = psVar4->sa_data[lVar9 + 2];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      lVar9 = 8;
    }
    Curl_infof(data,pcVar11,buf);
    Curl_resolv_unlock(data,dns);
  }
  *(ushort *)(socksreq + lVar9) = (ushort)local_310 << 8 | (ushort)local_310 >> 8;
  CVar6 = Curl_write_plain(conn,sockfd,socksreq,lVar9 + 2U,&written);
  if ((CVar6 == CURLE_OK) && (lVar9 + 2U == written)) {
    iVar7 = Curl_blockread_all(conn,sockfd,(char *)socksreq,10,&actualread);
    if ((iVar7 == 0) && (actualread == 10)) {
      if (socksreq[0] != '\x05') {
        pcVar11 = "SOCKS5 reply has wrong version, version should be 5.";
        goto LAB_00130478;
      }
      if (socksreq[3] == '\x04') {
        lVar9 = 0x16;
      }
      else {
        lVar9 = 10;
        if ((socksreq[3] != '\x03') || (lVar9 = (ulong)socksreq[4] + 7, (ulong)socksreq[4] < 4))
        goto LAB_00130940;
      }
      iVar7 = Curl_blockread_all(conn,sockfd,(char *)(socksreq + 10),lVar9 + -10,&actualread);
      if ((iVar7 == 0) && (lVar9 + -10 == actualread)) {
LAB_00130940:
        if (socksreq[1] == '\0') {
          Curl_infof(data,"SOCKS5 request granted.\n");
          curlx_nonblock(sockfd,1);
          return CURLE_OK;
        }
        if (socksreq[3] == '\x04') {
          local_310 = (ulong)socksreq[10];
          local_2f0 = (ulong)socksreq[0xb];
          local_308 = (char *)(ulong)socksreq[0xc];
          local_2f8 = (size_t)socksreq[0xd];
          local_2e0 = (ulong)socksreq[0xe];
          Curl_failf(data,
                     "Can\'t complete SOCKS5 connection to %02x%02x:%02x%02x:%02x%02x:%02x%02x:%02x%02x:%02x%02x:%02x%02x:%02x%02x:%d. (%d)"
                     ,(ulong)socksreq[4],(ulong)socksreq[5],(ulong)socksreq[6],(ulong)socksreq[7],
                     (ulong)socksreq[8],(ulong)socksreq[9],local_310,local_2f0,local_308,local_2f8,
                     local_2e0,(ulong)socksreq[0xf],(ulong)socksreq[0x10],(ulong)socksreq[0x11],
                     (ulong)socksreq[0x12],(ulong)socksreq[0x13],
                     (ulong)(ushort)(socksreq._20_2_ << 8 | (ushort)socksreq._20_2_ >> 8),
                     (ulong)socksreq[1]);
          return CURLE_COULDNT_CONNECT;
        }
        if (socksreq[3] == '\x03') {
          uVar1 = *(ushort *)(socksreq + lVar9 + -2);
          socksreq[lVar9 + -2] = '\0';
          Curl_failf(data,"Can\'t complete SOCKS5 connection to %s:%d. (%d)",socksreq + 5,
                     (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8),(ulong)socksreq[1]);
          return CURLE_COULDNT_CONNECT;
        }
        if (socksreq[3] == '\x01') {
          Curl_failf(data,"Can\'t complete SOCKS5 connection to %d.%d.%d.%d:%d. (%d)",
                     (ulong)socksreq[4],(ulong)socksreq[5],(ulong)socksreq[6],(ulong)socksreq[7],
                     (ulong)(ushort)(socksreq._8_2_ << 8 | (ushort)socksreq._8_2_ >> 8),
                     (ulong)socksreq[1]);
          return CURLE_COULDNT_CONNECT;
        }
        return CURLE_COULDNT_CONNECT;
      }
    }
    pcVar11 = "Failed to receive SOCKS5 connect request ack.";
  }
  else {
    pcVar11 = "Failed to send SOCKS5 connect request.";
  }
LAB_00130478:
  Curl_failf(data,pcVar11);
  return CURLE_COULDNT_CONNECT;
}

Assistant:

CURLcode Curl_SOCKS5(const char *proxy_user,
                     const char *proxy_password,
                     const char *hostname,
                     int remote_port,
                     int sockindex,
                     struct connectdata *conn)
{
  /*
    According to the RFC1928, section "6.  Replies". This is what a SOCK5
    replies:

        +----+-----+-------+------+----------+----------+
        |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
        +----+-----+-------+------+----------+----------+
        | 1  |  1  | X'00' |  1   | Variable |    2     |
        +----+-----+-------+------+----------+----------+

    Where:

    o  VER    protocol version: X'05'
    o  REP    Reply field:
    o  X'00' succeeded
  */

  unsigned char socksreq[600]; /* room for large user/pw (255 max each) */
  int idx;
  ssize_t actualread;
  ssize_t written;
  int result;
  CURLcode code;
  curl_socket_t sock = conn->sock[sockindex];
  struct Curl_easy *data = conn->data;
  timediff_t timeout;
  bool socks5_resolve_local =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS5) ? TRUE : FALSE;
  const size_t hostname_len = strlen(hostname);
  ssize_t len = 0;
  const unsigned long auth = data->set.socks5auth;
  bool allow_gssapi = FALSE;

  if(conn->bits.httpproxy)
    infof(conn->data, "SOCKS5: connecting to HTTP proxy %s port %d\n",
          hostname, remote_port);

  /* RFC1928 chapter 5 specifies max 255 chars for domain name in packet */
  if(!socks5_resolve_local && hostname_len > 255) {
    infof(conn->data, "SOCKS5: server resolving disabled for hostnames of "
          "length > 255 [actual len=%zu]\n", hostname_len);
    socks5_resolve_local = TRUE;
  }

  /* get timeout */
  timeout = Curl_timeleft(data, NULL, TRUE);

  if(timeout < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  (void)curlx_nonblock(sock, TRUE);

  /* wait until socket gets connected */
  result = SOCKET_WRITABLE(sock, timeout);

  if(-1 == result) {
    failf(conn->data, "SOCKS5: no connection here");
    return CURLE_COULDNT_CONNECT;
  }
  if(0 == result) {
    failf(conn->data, "SOCKS5: connection timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(result & CURL_CSELECT_ERR) {
    failf(conn->data, "SOCKS5: error occurred during connection");
    return CURLE_COULDNT_CONNECT;
  }

  if(auth & ~(CURLAUTH_BASIC | CURLAUTH_GSSAPI))
    infof(conn->data,
        "warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu\n",
        auth);
  if(!(auth & CURLAUTH_BASIC))
    /* disable username/password auth */
    proxy_user = NULL;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  if(auth & CURLAUTH_GSSAPI)
    allow_gssapi = TRUE;
#endif

  idx = 0;
  socksreq[idx++] = 5;   /* version */
  idx++;                 /* reserve for the number of authentication methods */
  socksreq[idx++] = 0;   /* no authentication */
  if(allow_gssapi)
    socksreq[idx++] = 1; /* GSS-API */
  if(proxy_user)
    socksreq[idx++] = 2; /* username/password */
  /* write the number of authentication methods */
  socksreq[1] = (unsigned char) (idx - 2);

  (void)curlx_nonblock(sock, FALSE);

  infof(data, "SOCKS5 communication to %s:%d\n", hostname, remote_port);

  code = Curl_write_plain(conn, sock, (char *)socksreq, (2 + (int)socksreq[1]),
                          &written);
  if(code || (written != (2 + (int)socksreq[1]))) {
    failf(data, "Unable to send initial SOCKS5 request.");
    return CURLE_COULDNT_CONNECT;
  }

  (void)curlx_nonblock(sock, TRUE);

  result = SOCKET_READABLE(sock, timeout);

  if(-1 == result) {
    failf(conn->data, "SOCKS5 nothing to read");
    return CURLE_COULDNT_CONNECT;
  }
  if(0 == result) {
    failf(conn->data, "SOCKS5 read timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(result & CURL_CSELECT_ERR) {
    failf(conn->data, "SOCKS5 read error occurred");
    return CURLE_RECV_ERROR;
  }

  (void)curlx_nonblock(sock, FALSE);

  result = Curl_blockread_all(conn, sock, (char *)socksreq, 2, &actualread);
  if(result || (actualread != 2)) {
    failf(data, "Unable to receive initial SOCKS5 response.");
    return CURLE_COULDNT_CONNECT;
  }

  if(socksreq[0] != 5) {
    failf(data, "Received invalid version in initial SOCKS5 response.");
    return CURLE_COULDNT_CONNECT;
  }
  if(socksreq[1] == 0) {
    /* Nothing to do, no authentication needed */
    ;
  }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  else if(allow_gssapi && (socksreq[1] == 1)) {
    code = Curl_SOCKS5_gssapi_negotiate(sockindex, conn);
    if(code) {
      failf(data, "Unable to negotiate SOCKS5 GSS-API context.");
      return CURLE_COULDNT_CONNECT;
    }
  }
#endif
  else if(socksreq[1] == 2) {
    /* Needs user name and password */
    size_t proxy_user_len, proxy_password_len;
    if(proxy_user && proxy_password) {
      proxy_user_len = strlen(proxy_user);
      proxy_password_len = strlen(proxy_password);
    }
    else {
      proxy_user_len = 0;
      proxy_password_len = 0;
    }

    /*   username/password request looks like
     * +----+------+----------+------+----------+
     * |VER | ULEN |  UNAME   | PLEN |  PASSWD  |
     * +----+------+----------+------+----------+
     * | 1  |  1   | 1 to 255 |  1   | 1 to 255 |
     * +----+------+----------+------+----------+
     */
    len = 0;
    socksreq[len++] = 1;    /* username/pw subnegotiation version */
    socksreq[len++] = (unsigned char) proxy_user_len;
    if(proxy_user && proxy_user_len)
      memcpy(socksreq + len, proxy_user, proxy_user_len);
    len += proxy_user_len;
    socksreq[len++] = (unsigned char) proxy_password_len;
    if(proxy_password && proxy_password_len)
      memcpy(socksreq + len, proxy_password, proxy_password_len);
    len += proxy_password_len;

    code = Curl_write_plain(conn, sock, (char *)socksreq, len, &written);
    if(code || (len != written)) {
      failf(data, "Failed to send SOCKS5 sub-negotiation request.");
      return CURLE_COULDNT_CONNECT;
    }

    result = Curl_blockread_all(conn, sock, (char *)socksreq, 2, &actualread);
    if(result || (actualread != 2)) {
      failf(data, "Unable to receive SOCKS5 sub-negotiation response.");
      return CURLE_COULDNT_CONNECT;
    }

    /* ignore the first (VER) byte */
    if(socksreq[1] != 0) { /* status */
      failf(data, "User was rejected by the SOCKS5 server (%d %d).",
            socksreq[0], socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    }

    /* Everything is good so far, user was authenticated! */
  }
  else {
    /* error */
    if(!allow_gssapi && (socksreq[1] == 1)) {
      failf(data,
            "SOCKS5 GSSAPI per-message authentication is not supported.");
      return CURLE_COULDNT_CONNECT;
    }
    if(socksreq[1] == 255) {
      if(!proxy_user || !*proxy_user) {
        failf(data,
              "No authentication method was acceptable. (It is quite likely"
              " that the SOCKS5 server wanted a username/password, since none"
              " was supplied to the server on this connection.)");
      }
      else {
        failf(data, "No authentication method was acceptable.");
      }
      return CURLE_COULDNT_CONNECT;
    }
    else {
      failf(data,
            "Undocumented SOCKS5 mode attempted to be used by server.");
      return CURLE_COULDNT_CONNECT;
    }
  }

  /* Authentication is complete, now specify destination to the proxy */
  len = 0;
  socksreq[len++] = 5; /* version (SOCKS5) */
  socksreq[len++] = 1; /* connect */
  socksreq[len++] = 0; /* must be zero */

  if(!socks5_resolve_local) {
    socksreq[len++] = 3; /* ATYP: domain name = 3 */
    socksreq[len++] = (char) hostname_len; /* address length */
    memcpy(&socksreq[len], hostname, hostname_len); /* address str w/o NULL */
    len += hostname_len;
  }
  else {
    struct Curl_dns_entry *dns;
    Curl_addrinfo *hp = NULL;
    int rc = Curl_resolv(conn, hostname, remote_port, &dns);

    if(rc == CURLRESOLV_ERROR)
      return CURLE_COULDNT_RESOLVE_HOST;

    if(rc == CURLRESOLV_PENDING) {
      /* this requires that we're in "wait for resolve" state */
      code = Curl_resolver_wait_resolv(conn, &dns);
      if(code)
        return code;
    }

    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns)
      hp = dns->addr;
    if(hp) {
      char buf[64];
      Curl_printable_address(hp, buf, sizeof(buf));

      if(hp->ai_family == AF_INET) {
        int i;
        struct sockaddr_in *saddr_in;
        socksreq[len++] = 1; /* ATYP: IPv4 = 1 */

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        for(i = 0; i < 4; i++) {
          socksreq[len++] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[i];
        }

        infof(data, "SOCKS5 connect to IPv4 %s (locally resolved)\n", buf);
      }
#ifdef ENABLE_IPV6
      else if(hp->ai_family == AF_INET6) {
        int i;
        struct sockaddr_in6 *saddr_in6;
        socksreq[len++] = 4; /* ATYP: IPv6 = 4 */

        saddr_in6 = (struct sockaddr_in6 *)(void *)hp->ai_addr;
        for(i = 0; i < 16; i++) {
          socksreq[len++] =
            ((unsigned char *)&saddr_in6->sin6_addr.s6_addr)[i];
        }

        infof(data, "SOCKS5 connect to IPv6 %s (locally resolved)\n", buf);
      }
#endif
      else {
        hp = NULL; /* fail! */

        failf(data, "SOCKS5 connection to %s not supported\n", buf);
      }

      Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    }
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS5 connect.",
            hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }